

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O1

void __thiscall
dtc::fdt::device_tree::parse_file
          (device_tree *this,text_input_buffer *input,
          vector<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
          *roots,bool *read_header)

{
  pointer *pppVar1;
  stack<std::shared_ptr<dtc::input_buffer>,_std::deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>_>
  *this_00;
  iterator __position;
  _Elt_pointer psVar2;
  element_type *peVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  undefined8 uVar5;
  bool bVar6;
  _Elt_pointer psVar7;
  int iVar8;
  _Elt_pointer psVar9;
  unsigned_long_long start;
  unsigned_long_long len;
  string ref;
  node_ptr n;
  string local_f8;
  string local_d8;
  undefined1 local_b8 [24];
  size_type sStack_a0;
  _Prime_rehash_policy local_98;
  __node_base_ptr local_88 [2];
  shared_ptr<dtc::fdt::node> local_78;
  vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
  *local_60;
  undefined1 local_58 [40];
  
  local_58._32_8_ = roots;
  text_input_buffer::next_token(input);
  bVar6 = text_input_buffer::consume(input,"/dts-v1/;");
  if (bVar6) {
    do {
      *read_header = true;
      text_input_buffer::next_token(input);
      bVar6 = text_input_buffer::consume(input,"/dts-v1/;");
    } while (bVar6);
  }
  bVar6 = text_input_buffer::consume(input,"/plugin/;");
  if (bVar6) {
    this->is_plugin = true;
  }
  text_input_buffer::next_token(input);
  if (*read_header == false) {
    text_input_buffer::parse_error(input,"Expected /dts-v1/; version string");
  }
  bVar6 = text_input_buffer::consume(input,"/memreserve/");
  if (bVar6) {
    local_60 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)&this->reservations;
    do {
      text_input_buffer::next_token(input);
      bVar6 = text_input_buffer::consume_integer_expression(input,(unsigned_long_long *)&local_f8);
      if (bVar6) {
        text_input_buffer::next_token(input);
        bVar6 = text_input_buffer::consume_integer_expression(input,(unsigned_long_long *)&local_d8)
        ;
        if (!bVar6) goto LAB_0012761c;
        local_b8._0_8_ = local_f8._M_dataplus._M_p;
        local_b8._8_8_ = local_d8._M_dataplus._M_p;
        __position._M_current =
             (this->reservations).
             super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
        if (__position._M_current ==
            (this->reservations).
            super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::
          vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
          ::_M_realloc_insert<std::pair<unsigned_long,unsigned_long>>
                    (local_60,__position,(pair<unsigned_long,_unsigned_long> *)local_b8);
        }
        else {
          (__position._M_current)->first = (unsigned_long)local_f8._M_dataplus._M_p;
          (__position._M_current)->second = (unsigned_long)local_d8._M_dataplus._M_p;
          pppVar1 = &(this->reservations).
                     super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish;
          *pppVar1 = *pppVar1 + 1;
        }
      }
      else {
LAB_0012761c:
        text_input_buffer::parse_error(input,"Expected size on /memreserve/ node.");
      }
      text_input_buffer::next_token(input);
      psVar2 = (input->input_stack).c.
               super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur;
      psVar7 = (input->input_stack).c.
               super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (psVar7 != psVar2) {
        psVar9 = psVar7;
        if (psVar7 == (input->input_stack).c.
                      super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ._M_impl.super__Deque_impl_data._M_finish._M_first) {
          psVar9 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
        }
        peVar3 = psVar9[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
        ;
        iVar8 = peVar3->cursor;
        if (((-1 < (long)iVar8) && (iVar8 < peVar3->size)) &&
           (peVar3->buffer[iVar8] == ';' && psVar7 != psVar2)) {
          input->cursor = input->cursor + 1;
          if (psVar7 == (input->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar7 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar3 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar8 = peVar3->cursor + 1;
          peVar3->cursor = iVar8;
          if (peVar3->size <= iVar8) {
            std::
            deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
            ::pop_back(&(input->input_stack).c);
          }
        }
      }
      text_input_buffer::next_token(input);
      bVar6 = text_input_buffer::consume(input,"/memreserve/");
    } while (bVar6);
  }
  if (this->valid == true) {
    this_00 = &input->input_stack;
    local_60 = (vector<std::pair<unsigned_long,unsigned_long>,std::allocator<std::pair<unsigned_long,unsigned_long>>>
                *)&this->defines;
    local_58._24_8_ = &this->deletions;
    do {
      bVar6 = text_input_buffer::finished(input);
      if (bVar6) {
        return;
      }
      local_78.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      local_78.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      bVar6 = text_input_buffer::consume(input,"/delete-node/");
      if (bVar6) {
        text_input_buffer::next_token(input);
        psVar2 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        psVar7 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (psVar7 == psVar2) {
LAB_00127848:
          text_input_buffer::parse_error(input,"Expected reference after top-level /delete-node/.");
          this->valid = false;
        }
        else {
          psVar9 = psVar7;
          if (psVar7 == (input->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar9 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar3 = psVar9[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar8 = peVar3->cursor;
          if ((((long)iVar8 < 0) || (peVar3->size <= iVar8)) || (peVar3->buffer[iVar8] != '&'))
          goto LAB_00127848;
          if (psVar7 != psVar2) {
            input->cursor = input->cursor + 1;
            if (psVar7 == (input->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar7 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar3 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar8 = peVar3->cursor + 1;
            peVar3->cursor = iVar8;
            if (peVar3->size <= iVar8) {
              std::
              deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
              ::pop_back(&this_00->c);
            }
          }
        }
        text_input_buffer::next_token(input);
        if (this->valid == true) {
          text_input_buffer::parse_node_name_abi_cxx11_((string *)local_b8,input);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._8_8_ ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)0x0) {
            text_input_buffer::parse_error(input,"Expected label name for top-level /delete-node/.")
            ;
            this->valid = false;
          }
          else {
            std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
            emplace_back<std::__cxx11::string>
                      ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                       local_58._24_8_,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b8
                      );
          }
          psVar2 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          psVar7 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (psVar7 == psVar2) {
LAB_00127bac:
            text_input_buffer::parse_error(input,"Missing semicolon.");
            this->valid = false;
          }
          else {
            psVar9 = psVar7;
            if (psVar7 == (input->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar9 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar3 = psVar9[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar8 = peVar3->cursor;
            if ((((long)iVar8 < 0) || (peVar3->size <= iVar8)) || (peVar3->buffer[iVar8] != ';'))
            goto LAB_00127bac;
            if (psVar7 != psVar2) {
              input->cursor = input->cursor + 1;
              if (psVar7 == (input->input_stack).c.
                            super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                psVar7 = (input->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              peVar3 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              iVar8 = peVar3->cursor + 1;
              peVar3->cursor = iVar8;
              if (peVar3->size <= iVar8) {
                std::
                deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                ::pop_back(&this_00->c);
              }
            }
          }
          text_input_buffer::next_token(input);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_b8._0_8_ !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_b8 + 0x10)) {
            operator_delete((void *)local_b8._0_8_,
                            (ulong)((long)(_Hash_node_base **)local_b8._16_8_ + 1));
          }
        }
      }
      else {
        psVar2 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_start._M_cur;
        psVar7 = (input->input_stack).c.
                 super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_cur;
        if (psVar7 == psVar2) {
          bVar6 = false;
        }
        else {
          psVar9 = psVar7;
          if (psVar7 == (input->input_stack).c.
                        super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish._M_first) {
            psVar9 = (input->input_stack).c.
                     super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
          }
          peVar3 = psVar9[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          iVar8 = peVar3->cursor;
          bVar6 = false;
          if ((-1 < (long)iVar8) && (iVar8 < peVar3->size)) {
            bVar6 = peVar3->buffer[iVar8] == '/';
          }
        }
        if (bVar6) {
          if (psVar7 != psVar2) {
            input->cursor = input->cursor + 1;
            if (psVar7 == (input->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar7 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar3 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar8 = peVar3->cursor + 1;
            peVar3->cursor = iVar8;
            if (peVar3->size <= iVar8) {
              std::
              deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
              ::pop_back(&this_00->c);
            }
          }
          if (!bVar6) goto LAB_001279f2;
          text_input_buffer::next_token(input);
          local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
          local_f8._M_string_length = 0;
          local_f8.field_2._M_local_buf[0] = '\0';
          local_b8._0_8_ = local_b8 + 0x30;
          local_b8._8_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)0x1;
          local_b8._16_8_ = (_Hash_node_base *)0x0;
          sStack_a0 = 0;
          local_98._M_max_load_factor = 1.0;
          local_98._4_4_ = 0;
          local_98._M_next_resize = 0;
          local_88[0] = (__node_base_ptr)0x0;
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          local_d8._M_string_length = 0;
          local_d8.field_2._M_local_buf[0] = '\0';
          node::parse((node *)local_58,input,this,&local_f8,(string_set *)local_b8,&local_d8,
                      (define_map *)local_60);
          uVar5 = local_58._8_8_;
          local_78.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)local_58._0_8_;
          _Var4._M_pi = local_78.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
          local_58._0_8_ = (element_type *)0x0;
          local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_78.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
               = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
          if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p,
                            CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                     local_d8.field_2._M_local_buf[0]) + 1);
          }
          std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
          ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                         *)local_b8);
LAB_00127e50:
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p,
                            CONCAT71(local_f8.field_2._M_allocated_capacity._1_7_,
                                     local_f8.field_2._M_local_buf[0]) + 1);
          }
        }
        else {
LAB_001279f2:
          psVar2 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_start._M_cur;
          psVar7 = (input->input_stack).c.
                   super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_cur;
          if (psVar7 == psVar2) {
            bVar6 = false;
          }
          else {
            psVar9 = psVar7;
            if (psVar7 == (input->input_stack).c.
                          super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_first) {
              psVar9 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
            }
            peVar3 = psVar9[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            iVar8 = peVar3->cursor;
            bVar6 = false;
            if ((-1 < (long)iVar8) && (iVar8 < peVar3->size)) {
              bVar6 = peVar3->buffer[iVar8] == '&';
            }
          }
          if (bVar6) {
            if (psVar7 != psVar2) {
              input->cursor = input->cursor + 1;
              if (psVar7 == (input->input_stack).c.
                            super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                            ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                psVar7 = (input->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
              }
              peVar3 = psVar7[-1].super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr;
              iVar8 = peVar3->cursor + 1;
              peVar3->cursor = iVar8;
              if (peVar3->size <= iVar8) {
                std::
                deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                ::pop_back(&this_00->c);
              }
            }
            if (bVar6) {
              text_input_buffer::next_token(input);
              local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
              local_f8._M_string_length = 0;
              local_f8.field_2._M_local_buf[0] = '\0';
              psVar2 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
              psVar7 = (input->input_stack).c.
                       super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                       ._M_impl.super__Deque_impl_data._M_finish._M_cur;
              if (psVar7 == psVar2) {
                bVar6 = false;
              }
              else {
                psVar9 = psVar7;
                if (psVar7 == (input->input_stack).c.
                              super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                  psVar9 = (input->input_stack).c.
                           super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                           ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
                }
                peVar3 = psVar9[-1].
                         super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                iVar8 = peVar3->cursor;
                bVar6 = false;
                if ((-1 < (long)iVar8) && (iVar8 < peVar3->size)) {
                  bVar6 = peVar3->buffer[iVar8] == '{';
                }
              }
              if (bVar6) {
                if (psVar7 != psVar2) {
                  input->cursor = input->cursor + 1;
                  if (psVar7 == (input->input_stack).c.
                                super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                    psVar7 = (input->input_stack).c.
                             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
                  }
                  peVar3 = psVar7[-1].
                           super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  iVar8 = peVar3->cursor + 1;
                  peVar3->cursor = iVar8;
                  if (peVar3->size <= iVar8) {
                    std::
                    deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                    ::pop_back(&this_00->c);
                  }
                }
                if ((!bVar6) || (this->is_plugin != true)) goto LAB_00127d1b;
                text_input_buffer::parse_to_abi_cxx11_((string *)local_b8,input,'}');
                std::__cxx11::string::operator=((string *)&local_f8,(string *)local_b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_b8 + 0x10)) {
                  operator_delete((void *)local_b8._0_8_,
                                  (ulong)((long)(_Hash_node_base **)local_b8._16_8_ + 1));
                }
                psVar2 = (input->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_start._M_cur;
                psVar7 = (input->input_stack).c.
                         super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                         ._M_impl.super__Deque_impl_data._M_finish._M_cur;
                bVar6 = true;
                if (psVar7 != psVar2) {
                  psVar9 = psVar7;
                  if (psVar7 == (input->input_stack).c.
                                super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                                ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                    psVar9 = (input->input_stack).c.
                             super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                             ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
                  }
                  peVar3 = psVar9[-1].
                           super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
                  iVar8 = peVar3->cursor;
                  if (((-1 < (long)iVar8) && (iVar8 < peVar3->size)) &&
                     (peVar3->buffer[iVar8] == '}' && psVar7 != psVar2)) {
                    input->cursor = input->cursor + 1;
                    if (psVar7 == (input->input_stack).c.
                                  super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
                      psVar7 = (input->input_stack).c.
                               super__Deque_base<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x20;
                    }
                    peVar3 = psVar7[-1].
                             super___shared_ptr<dtc::input_buffer,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr;
                    iVar8 = peVar3->cursor + 1;
                    peVar3->cursor = iVar8;
                    if (peVar3->size <= iVar8) {
                      std::
                      deque<std::shared_ptr<dtc::input_buffer>,_std::allocator<std::shared_ptr<dtc::input_buffer>_>_>
                      ::pop_back(&this_00->c);
                    }
                  }
                }
              }
              else {
LAB_00127d1b:
                text_input_buffer::parse_node_name_abi_cxx11_((string *)local_b8,input);
                std::__cxx11::string::operator=((string *)&local_f8,(string *)local_b8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b8._0_8_ !=
                    (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(local_b8 + 0x10)) {
                  operator_delete((void *)local_b8._0_8_,
                                  (ulong)((long)(_Hash_node_base **)local_b8._16_8_ + 1));
                }
                bVar6 = false;
              }
              text_input_buffer::next_token(input);
              local_b8._0_8_ = local_b8 + 0x30;
              local_b8._8_8_ =
                   (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)0x1;
              local_b8._16_8_ = (_Hash_node_base *)0x0;
              sStack_a0 = 0;
              local_98._M_max_load_factor = 1.0;
              local_98._4_4_ = 0;
              local_98._M_next_resize = 0;
              local_88[0] = (__node_base_ptr)0x0;
              local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
              local_d8._M_string_length = 0;
              local_d8.field_2._M_local_buf[0] = '\0';
              node::parse((node *)local_58,input,this,&local_f8,(string_set *)local_b8,&local_d8,
                          (define_map *)local_60);
              uVar5 = local_58._8_8_;
              local_78.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                   (element_type *)local_58._0_8_;
              _Var4._M_pi = local_78.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount._M_pi;
              local_58._0_8_ = (element_type *)0x0;
              local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
              local_78.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar5;
              if (_Var4._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var4._M_pi);
              }
              if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
                  (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                operator_delete(local_d8._M_dataplus._M_p,
                                CONCAT71(local_d8.field_2._M_allocated_capacity._1_7_,
                                         local_d8.field_2._M_local_buf[0]) + 1);
              }
              std::
              _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
              ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                             *)local_b8);
              if (local_78.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
                  (element_type *)0x0) {
                (local_78.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                name_is_path_reference = bVar6;
              }
              goto LAB_00127e50;
            }
          }
          text_input_buffer::parse_error(input,"Failed to find root node /.");
        }
        if (local_78.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          this->valid = false;
        }
        else {
          std::
          vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>>::
          emplace_back<std::shared_ptr<dtc::fdt::node>>
                    ((vector<std::shared_ptr<dtc::fdt::node>,std::allocator<std::shared_ptr<dtc::fdt::node>>>
                      *)local_58._32_8_,&local_78);
        }
        text_input_buffer::next_token(input);
      }
      if (local_78.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
          != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_78.super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi);
      }
    } while (this->valid != false);
  }
  return;
}

Assistant:

void
device_tree::parse_file(text_input_buffer &input,
                        std::vector<node_ptr> &roots,
                        bool &read_header)
{
	input.next_token();
	// Read the header
	while (input.consume("/dts-v1/;"))
	{
		read_header = true;
		input.next_token();
	}
	if (input.consume("/plugin/;"))
	{
		is_plugin = true;
	}
	input.next_token();
	if (!read_header)
	{
		input.parse_error("Expected /dts-v1/; version string");
	}
	// Read any memory reservations
	while (input.consume("/memreserve/"))
	{
		unsigned long long start, len;
		input.next_token();
		// Read the start and length.
		if (!(input.consume_integer_expression(start) &&
		    (input.next_token(),
		    input.consume_integer_expression(len))))
		{
			input.parse_error("Expected size on /memreserve/ node.");
		}
		else
		{
			reservations.push_back(reservation(start, len));
		}
		input.next_token();
		input.consume(';');
		input.next_token();
	}
	while (valid && !input.finished())
	{
		node_ptr n;
		if (input.consume("/delete-node/"))
		{
			// Top-level /delete-node/ directives refer to references that must
			// be deleted later.
			input.next_token();
			auto expect = [&](auto token, const char *msg)
			{
				if (!input.consume(token))
				{
					input.parse_error(msg);
					valid = false;
				}
				input.next_token();
				return valid;
			};
			if (expect('&', "Expected reference after top-level /delete-node/."))
			{
				string ref = input.parse_node_name();
				if (ref == string())
				{
					input.parse_error("Expected label name for top-level /delete-node/.");
					valid = false;
				}
				else
				{
					deletions.push_back(std::move(ref));
				}
				expect(';', "Missing semicolon.");
			}
			continue;
		}
		else if (input.consume('/'))
		{
			input.next_token();
			n = node::parse(input, *this, string(), string_set(), string(), &defines);
		}
		else if (input.consume('&'))
		{
			input.next_token();
			string name;
			bool name_is_path_reference = false;
			// This is to deal with names intended as path references, e.g. &{/path}.
			// While it may make sense in a non-plugin context, we don't support such
			// usage at this time.
			if (input.consume('{') && is_plugin)
			{
				name = input.parse_to('}');
				input.consume('}');
				name_is_path_reference = true;
			}
			else
			{
				name = input.parse_node_name();
			}
			input.next_token();
			n = node::parse(input, *this, std::move(name), string_set(), string(), &defines);
			if (n)
			{
				n->name_is_path_reference = name_is_path_reference;
			}
		}
		else
		{
			input.parse_error("Failed to find root node /.");
		}
		if (n)
		{
			roots.push_back(std::move(n));
		}
		else
		{
			valid = false;
		}
		input.next_token();
	}
}